

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O2

void testExactL2<makeTests(TasGrid::TypeAcceleration,int)::__16>(TasmanianSparseGrid *grid)

{
  BaseCanonicalGrid *pBVar1;
  double dVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  TypeOneDRule TVar6;
  ostream *poVar7;
  runtime_error *this;
  allocator_type *__a;
  double *extraout_RDX;
  double *y_00;
  double *extraout_RDX_00;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator_type local_14a;
  allocator_type local_149;
  vector<double,_std::allocator<double>_> x;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  local_128;
  vector<double,_std::allocator<double>_> y;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  TasmanianSparseGrid ref_grid;
  
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbfe0000000000000;
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xbfe0000000000000;
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&ref_grid,__l,&local_14a);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fe6666666666666;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fe6666666666666;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __a = &local_149;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&y;
  std::vector<double,_std::allocator<double>_>::vector(&x,__l_00,__a);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&ref_grid);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&ref_grid);
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&ref_grid,grid);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    lVar8 = 0;
    lVar9 = 0;
  }
  else {
    lVar8 = (long)*(int *)(pBVar1 + 0x10);
    lVar9 = (long)*(int *)(pBVar1 + 0x14);
  }
  uVar4 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  TasGrid::TasmanianSparseGrid::getPoints(&x,grid);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)*(int *)(pBVar1 + 0x14);
  }
  iVar5 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  std::vector<double,_std::allocator<double>_>::vector(&y,lVar11 * iVar5,&local_14a);
  uVar12 = 0;
  uVar10 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar10 = uVar12;
  }
  lVar11 = 0;
  y_00 = extraout_RDX;
  while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
    makeTests::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               ((long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar12),
               (double *)
               ((long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar11),y_00,(int)__a);
    lVar11 = lVar11 + lVar9 * 8;
    uVar12 = uVar12 + lVar8 * 8;
    y_00 = extraout_RDX_00;
  }
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_128.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_128.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_128.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_manager;
  TasGrid::loadNeededPoints<true,false>
            ((function<void_(const_double_*,_double_*,_unsigned_long)> *)&local_d8,&ref_grid,1);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  TVar6 = TasGrid::TasmanianSparseGrid::getRule();
  cVar3 = TasGrid::OneDimensionalMeta::isNonNested(TVar6);
  if (cVar3 == '\0') {
    uVar14 = 0;
    uVar15 = 0;
  }
  else {
    uVar14 = 0xd2f1a9fc;
    uVar15 = 0x3f50624d;
  }
  TasGrid::loadUnstructuredDataL2
            (&local_128.first,&local_128.second,(double)CONCAT44(uVar15,uVar14),grid);
  TVar6 = TasGrid::TasmanianSparseGrid::getRule();
  cVar3 = TasGrid::OneDimensionalMeta::isNonNested(TVar6);
  if (cVar3 == '\0') {
    dVar2 = coefficientDifference(&ref_grid,grid);
    if (1e-12 < dVar2) goto LAB_0010c268;
  }
  TVar6 = TasGrid::TasmanianSparseGrid::getRule();
  cVar3 = TasGrid::OneDimensionalMeta::isNonNested(TVar6);
  if (cVar3 != '\0') {
    dVar2 = evalDifference(&local_128.first,&ref_grid,grid);
    if (0.01 < dVar2) {
LAB_0010c268:
      std::operator<<((ostream *)&std::cout,"Failed exact unstructured construction\n");
      std::operator<<((ostream *)&std::cout,"Observed coefficients error: ");
      dVar2 = coefficientDifference(&ref_grid,grid);
      poVar7 = std::ostream::_M_insert<double>(dVar2);
      std::operator<<(poVar7,"\n");
      std::operator<<((ostream *)&std::cout,"Observed evaluate error: ");
      dVar2 = evalDifference(&local_128.first,&ref_grid,grid);
      poVar7 = std::ostream::_M_insert<double>(dVar2);
      std::operator<<(poVar7,"\n");
      TasGrid::TasmanianSparseGrid::printStats((ostream *)grid);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"test failed");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~pair(&local_128);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&ref_grid);
  return;
}

Assistant:

void testExactL2(TasmanianSparseGrid &&grid, CallableModel model){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});
    auto ref_grid = grid;

    auto data = generateExactData(grid, model);

    loadNeededPoints(model, ref_grid, 1);
    if (OneDimensionalMeta::isNonNested(grid.getRule()))
        loadUnstructuredDataL2(data.first, data.second, 1.E-3, grid);
    else
        loadUnstructuredDataL2(data.first, data.second, 0.0, grid);

    if ((not OneDimensionalMeta::isNonNested(grid.getRule()) and coefficientDifference(ref_grid, grid) > Maths::num_tol)
        or (OneDimensionalMeta::isNonNested(grid.getRule()) and evalDifference(data.first, ref_grid, grid) > 1.E-2))
    {
        cout << "Failed exact unstructured construction\n";
        cout << "Observed coefficients error: " << coefficientDifference(ref_grid, grid) << "\n";
        cout << "Observed evaluate error: " << evalDifference(data.first, ref_grid, grid) << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}